

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::umul_extended_invalid_lsb
               (NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ShaderType shaderType;
  ShaderFunction function;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  bool bVar2;
  char *__s;
  long *plVar3;
  size_type *psVar4;
  long lVar5;
  string shaderSource;
  allocator<char> local_c1;
  long local_c0;
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  paVar1 = &shaderSource.field_2;
  shaderSource._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&shaderSource,"umulExtended: Invalid lsb type.","");
  NegativeTestContext::beginSection(ctx,&shaderSource);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderSource._M_dataplus._M_p != paVar1) {
    operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1);
  }
  lVar5 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar5];
    bVar2 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar2) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_c1);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1c79853);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        shaderSource.field_2._M_allocated_capacity = *psVar4;
        shaderSource.field_2._8_8_ = plVar3[3];
        shaderSource._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        shaderSource.field_2._M_allocated_capacity = *psVar4;
        shaderSource._M_dataplus._M_p = (pointer)*plVar3;
      }
      shaderSource._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      NegativeTestContext::beginSection(ctx,&shaderSource);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != paVar1) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      local_58 = lVar5;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar5 = 0;
      do {
        function = deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes[lVar5];
        local_c0 = lVar5;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceMulExtended_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_LAST,function,function,
                   function,deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[lVar5]
                   ,(DataType)shaderSource._M_dataplus._M_p);
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,shaderSource._M_dataplus._M_p,
                   shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
        shaderSource_00._M_string_length = shaderSource._M_string_length;
        shaderSource_00._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
        shaderSource_00.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
        shaderSource_00.field_2._8_8_ = shaderSource.field_2._8_8_;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_98[0],shaderSource_00);
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shaderSource._M_dataplus._M_p != paVar1) {
          operator_delete(shaderSource._M_dataplus._M_p,
                          shaderSource.field_2._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceMulExtended_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_LAST,function,function,
                   function,deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes
                            [local_c0],(DataType)shaderSource._M_dataplus._M_p);
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,shaderSource._M_dataplus._M_p,
                   shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
        shaderSource_01._M_string_length = shaderSource._M_string_length;
        shaderSource_01._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
        shaderSource_01.field_2._M_allocated_capacity = shaderSource.field_2._M_allocated_capacity;
        shaderSource_01.field_2._8_8_ = shaderSource.field_2._8_8_;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_78[0],shaderSource_01);
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shaderSource._M_dataplus._M_p != paVar1) {
          operator_delete(shaderSource._M_dataplus._M_p,
                          shaderSource.field_2._M_allocated_capacity + 1);
        }
        lVar5 = 0;
        do {
          if (*(ShaderFunction *)
               ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes + lVar5) !=
              function) {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceMulExtended_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_LAST,function,function,
                       function,*(ShaderFunction *)
                                 ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::
                                        s_uintTypes + lVar5),(DataType)shaderSource._M_dataplus._M_p
                      );
            local_b8[0] = local_a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_b8,shaderSource._M_dataplus._M_p,
                       shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
            shaderSource_02._M_string_length = shaderSource._M_string_length;
            shaderSource_02._M_dataplus._M_p = shaderSource._M_dataplus._M_p;
            shaderSource_02.field_2._M_allocated_capacity =
                 shaderSource.field_2._M_allocated_capacity;
            shaderSource_02.field_2._8_8_ = shaderSource.field_2._8_8_;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_b8[0],shaderSource_02);
            if (local_b8[0] != local_a8) {
              operator_delete(local_b8[0],local_a8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)shaderSource._M_dataplus._M_p != paVar1) {
              operator_delete(shaderSource._M_dataplus._M_p,
                              shaderSource.field_2._M_allocated_capacity + 1);
            }
          }
          lVar5 = lVar5 + 4;
        } while (lVar5 != 0x10);
        lVar5 = local_c0 + 1;
      } while (lVar5 != 4);
      NegativeTestContext::endSection(ctx);
      lVar5 = local_58;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void umul_extended_invalid_lsb (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));

	ctx.beginSection("umulExtended: Invalid lsb type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_uintTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourceMulExtended(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_UMUL_EXTENDED, s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceMulExtended(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_UMUL_EXTENDED, s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_uintTypes); ++dataTypeNdx2)
				{
					if (s_uintTypes[dataTypeNdx2] == s_uintTypes[dataTypeNdx])
						continue;

					const std::string shaderSource(genShaderSourceMulExtended(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_UMUL_EXTENDED, s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx2]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}